

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_append(tree *t,char *name,size_t name_length)

{
  archive_string *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  archive_string *unaff_retaddr;
  size_t size_needed;
  char c;
  archive_string *as;
  
  *(undefined1 *)(*(long *)((long)in_RDI + 0x40) + *(long *)((long)in_RDI + 0x60)) = 0;
  *(undefined8 *)((long)in_RDI + 0x48) = *(undefined8 *)((long)in_RDI + 0x60);
  while( true ) {
    c = false;
    if ((archive_string *)0x1 < in_RDX) {
      c = *(char *)((long)in_RDX + (in_RSI - 1)) == '/';
    }
    if ((bool)c == false) break;
    in_RDX = (archive_string *)((long)&in_RDX[-1].buffer_length + 7);
  }
  as = (archive_string *)((long)&in_RDX->s + *(long *)((long)in_RDI + 0x60) + 2);
  archive_string_ensure(in_RDX,(size_t)as);
  if ((*(long *)((long)in_RDI + 0x60) != 0) &&
     (*(char *)(*(long *)((long)in_RDI + 0x40) + *(long *)((long)in_RDI + 0x48) + -1) != '/')) {
    archive_strappend_char(as,c);
  }
  *(long *)((long)in_RDI + 0x58) = *(long *)((long)in_RDI + 0x40) + *(long *)((long)in_RDI + 0x48);
  archive_strncat(unaff_retaddr,in_RDI,in_RSI);
  *(undefined8 *)((long)in_RDI + 0x1a8) = *(undefined8 *)((long)in_RDI + 0x58);
  return;
}

Assistant:

static void
tree_append(struct tree *t, const char *name, size_t name_length)
{
	size_t size_needed;

	t->path.s[t->dirname_length] = '\0';
	t->path.length = t->dirname_length;
	/* Strip trailing '/' from name, unless entire name is "/". */
	while (name_length > 1 && name[name_length - 1] == '/')
		name_length--;

	/* Resize pathname buffer as needed. */
	size_needed = name_length + t->dirname_length + 2;
	archive_string_ensure(&t->path, size_needed);
	/* Add a separating '/' if it's needed. */
	if (t->dirname_length > 0 && t->path.s[archive_strlen(&t->path)-1] != '/')
		archive_strappend_char(&t->path, '/');
	t->basename = t->path.s + archive_strlen(&t->path);
	archive_strncat(&t->path, name, name_length);
	t->restore_time.name = t->basename;
}